

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_return.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::dispatch::detail::Handle_Return<Object_Lifetime_Vector2<float>>::
handle<Object_Lifetime_Vector2<float>,void>
          (Handle_Return<Object_Lifetime_Vector2<float>> *this,Object_Lifetime_Vector2<float> *r)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar2;
  Boxed_Value BVar3;
  shared_ptr<Object_Lifetime_Vector2<float>_> local_28;
  
  local_28.super___shared_ptr<Object_Lifetime_Vector2<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_28.super___shared_ptr<Object_Lifetime_Vector2<float>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (local_28.super___shared_ptr<Object_Lifetime_Vector2<float>,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_use_count = 1;
  (local_28.super___shared_ptr<Object_Lifetime_Vector2<float>,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_weak_count = 1;
  (local_28.super___shared_ptr<Object_Lifetime_Vector2<float>,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005a92b0
  ;
  local_28.super___shared_ptr<Object_Lifetime_Vector2<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_28.super___shared_ptr<Object_Lifetime_Vector2<float>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi + 1);
  *(float *)&local_28.super___shared_ptr<Object_Lifetime_Vector2<float>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi[1]._vptr__Sp_counted_base = r->x;
  *(float *)((long)&local_28.
                    super___shared_ptr<Object_Lifetime_Vector2<float>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi[1]._vptr__Sp_counted_base + 4) = r->y;
  sVar2 = Boxed_Value::Object_Data::get<Object_Lifetime_Vector2<float>>
                    ((Object_Data *)this,&local_28,true);
  _Var1 = sVar2.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_28.super___shared_ptr<Object_Lifetime_Vector2<float>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.
               super___shared_ptr<Object_Lifetime_Vector2<float>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value handle(T &&r) {
          return Boxed_Value(std::make_shared<T>(std::forward<T>(r)), true);
        }